

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpXmlWriter.c
# Opt level: O1

deBool qpXmlWriter_endDocument(qpXmlWriter *writer)

{
  if (writer->xmlPrevIsStartElement != 0) {
    fwrite(">\n",2,1,(FILE *)writer->outputFile);
    writer->xmlPrevIsStartElement = 0;
  }
  writer->xmlIsWriting = 0;
  return 1;
}

Assistant:

deBool qpXmlWriter_endDocument (qpXmlWriter* writer)
{
	DE_ASSERT(writer);
	DE_ASSERT(writer->xmlIsWriting);
	DE_ASSERT(writer->xmlElementDepth == 0);
	closePending(writer);
	writer->xmlIsWriting = DE_FALSE;
	return DE_TRUE;
}